

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O0

char * lookup_name(name_cache *cache,_func_char_ptr_name_cache_ptr_id_t *lookup_fn,id_t id)

{
  int iVar1;
  long lVar2;
  uint in_EDX;
  code *in_RSI;
  long in_RDI;
  int slot;
  char *name;
  char *local_8;
  
  *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
  iVar1 = (int)((ulong)in_EDX % *(ulong *)(in_RDI + 0x20));
  if (*(long *)(in_RDI + (long)iVar1 * 0x10 + 0x30) != 0) {
    if (*(uint *)(in_RDI + 0x28 + (long)iVar1 * 0x10) == in_EDX) {
      *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
      if (*(char **)(in_RDI + (long)iVar1 * 0x10 + 0x30) == "(noname)") {
        return (char *)0x0;
      }
      return *(char **)(in_RDI + (long)iVar1 * 0x10 + 0x30);
    }
    if (*(char **)(in_RDI + (long)iVar1 * 0x10 + 0x30) != "(noname)") {
      free(*(void **)(in_RDI + (long)iVar1 * 0x10 + 0x30));
    }
    *(undefined8 *)(in_RDI + (long)iVar1 * 0x10 + 0x30) = 0;
  }
  lVar2 = (*in_RSI)(in_RDI,in_EDX);
  if (lVar2 == 0) {
    *(char **)(in_RDI + (long)iVar1 * 0x10 + 0x30) = "(noname)";
    *(uint *)(in_RDI + 0x28 + (long)iVar1 * 0x10) = in_EDX;
    local_8 = (char *)0x0;
  }
  else {
    *(long *)(in_RDI + (long)iVar1 * 0x10 + 0x30) = lVar2;
    *(uint *)(in_RDI + 0x28 + (long)iVar1 * 0x10) = in_EDX;
    local_8 = *(char **)(in_RDI + (long)iVar1 * 0x10 + 0x30);
  }
  return local_8;
}

Assistant:

static const char *
lookup_name(struct name_cache *cache,
    const char * (*lookup_fn)(struct name_cache *, id_t), id_t id)
{
	const char *name;
	int slot;


	cache->probes++;

	slot = id % cache->size;
	if (cache->cache[slot].name != NULL) {
		if (cache->cache[slot].id == id) {
			cache->hits++;
			if (cache->cache[slot].name == NO_NAME)
				return (NULL);
			return (cache->cache[slot].name);
		}
		if (cache->cache[slot].name != NO_NAME)
			free((void *)(uintptr_t)cache->cache[slot].name);
		cache->cache[slot].name = NULL;
	}

	name = (lookup_fn)(cache, id);
	if (name == NULL) {
		/* Cache and return the negative response. */
		cache->cache[slot].name = NO_NAME;
		cache->cache[slot].id = id;
		return (NULL);
	}

	cache->cache[slot].name = name;
	cache->cache[slot].id = id;
	return (cache->cache[slot].name);
}